

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O0

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::LoopUnrollCase::generateProgramData
          (ProgramData *__return_storage_ptr__,LoopUnrollCase *this,bool optimized)

{
  int iVar1;
  CaseShaderType shaderType;
  CaseType caseType;
  CaseShaderType extraout_EDX;
  CaseShaderType extraout_EDX_00;
  CaseShaderType extraout_EDX_01;
  CaseShaderType extraout_EDX_02;
  CaseShaderType extraout_EDX_03;
  CaseShaderType extraout_EDX_04;
  CaseShaderType extraout_EDX_05;
  CaseShaderType extraout_EDX_06;
  CaseShaderType shaderType_00;
  undefined7 in_register_00000011;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  byte local_101;
  string local_100;
  byte local_db;
  byte local_da;
  allocator<char> local_d9;
  string local_d8;
  byte local_b6;
  byte local_b5;
  byte local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string repetition;
  bool optimized_local;
  LoopUnrollCase *this_local;
  
  local_a1 = 0;
  local_b5 = 0;
  local_b6 = 0;
  local_da = 0;
  local_db = 0;
  local_101 = 0;
  caseType = (CaseType)CONCAT71(in_register_00000011,optimized);
  repetition.field_2._M_local_buf[0xf] = optimized;
  if (optimized) {
    Performance::(anonymous_namespace)::LoopUnrollCase::expressionTemplate_abi_cxx11_
              (&local_a0,(LoopUnrollCase *)(ulong)this->m_caseType,caseType);
    local_a1 = 1;
    std::operator+(&local_80,"\t",&local_a0);
    local_b5 = 1;
    std::operator+(&local_60,&local_80,";\n");
    local_b6 = 1;
    iVar1 = this->m_numRepetitions;
    std::allocator<char>::allocator();
    local_da = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_d9);
    local_db = 1;
    repeatIndexedTemplate((string *)local_40,&local_60,iVar1,&local_d8,0);
    shaderType_00 = extraout_EDX;
  }
  else {
    iVar1 = this->m_numRepetitions;
    Performance::(anonymous_namespace)::LoopUnrollCase::expressionTemplate_abi_cxx11_
              (&local_100,(LoopUnrollCase *)(ulong)this->m_caseType,caseType);
    local_101 = 1;
    loop((string *)local_40,iVar1,&local_100);
    shaderType_00 = extraout_EDX_00;
  }
  if ((local_101 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_100);
    shaderType_00 = extraout_EDX_01;
  }
  if ((local_db & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d8);
    shaderType_00 = extraout_EDX_02;
  }
  if ((local_da & 1) != 0) {
    std::allocator<char>::~allocator(&local_d9);
    shaderType_00 = extraout_EDX_03;
  }
  if ((local_b6 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_60);
    shaderType_00 = extraout_EDX_04;
  }
  if ((local_b5 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_80);
    shaderType_00 = extraout_EDX_05;
  }
  if ((local_a1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
    shaderType_00 = extraout_EDX_06;
  }
  shaderType = (this->super_ShaderOptimizationCase).m_caseShaderType;
  Performance::(anonymous_namespace)::getShaderPrecision_abi_cxx11_
            (&local_188,(_anonymous_namespace_ *)(ulong)shaderType,shaderType_00);
  std::operator+(&local_168,"\t",&local_188);
  std::operator+(&local_148,&local_168," vec4 valueOrig = value;\n");
  std::operator+(&local_128,&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  defaultProgramData(__return_storage_ptr__,shaderType,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const string repetition = optimized ? repeatIndexedTemplate("\t" + expressionTemplate(m_caseType) + ";\n", m_numRepetitions)
											: loop(m_numRepetitions, expressionTemplate(m_caseType));

		return defaultProgramData(m_caseShaderType, "\t" + getShaderPrecision(m_caseShaderType) + " vec4 valueOrig = value;\n" + repetition);
	}